

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# configuration.c
# Opt level: O2

value configuration_value_type(configuration config,char *key,type_id id)

{
  int iVar1;
  value pvVar2;
  value pvVar3;
  
  if (config == (configuration)0x0) {
    return (value)0x0;
  }
  pvVar2 = configuration_object_get(config,key);
  if (pvVar2 == (value)0x0) {
    pvVar3 = (value)0x0;
  }
  else {
    iVar1 = value_type_id(pvVar2);
    pvVar3 = (value)0x0;
    if (iVar1 == id) {
      pvVar3 = pvVar2;
    }
  }
  return pvVar3;
}

Assistant:

value configuration_value_type(configuration config, const char *key, type_id id)
{
	if (config == NULL)
	{
		return NULL;
	}

	value v = configuration_object_get(config, key);

	if (v == NULL)
	{
		return NULL;
	}

	if (value_type_id(v) != id)
	{
		return NULL;
	}

	return v;
}